

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_LE_Test::iu_AssertionTest_x_iutest_x_LE_Test
          (iu_AssertionTest_x_iutest_x_LE_Test *this)

{
  iu_AssertionTest_x_iutest_x_LE_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_AssertionTest_x_iutest_x_LE_Test_00611008;
  return;
}

Assistant:

IUTEST(AssertionTest, LE)
{
    int x0=0, y0=0;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_LE(x0, y0);
    IUTEST_EXPECT_LE(f0, f1);
    IUTEST_INFORM_LE(0.0, 0x1);
    IUTEST_EXPECT_LE(d0, d1);
}